

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_binbuf.c
# Opt level: O2

void binbuf_gettext(_binbuf *x,char **bufp,int *lengthp)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  char *old;
  size_t sVar4;
  char *pcVar6;
  size_t oldsize;
  t_atom *a;
  int iVar7;
  size_t sVar8;
  bool bVar9;
  char string [1000];
  ulong uVar5;
  
  uVar5 = 0;
  old = (char *)getbytes(0);
  a = x->b_vec;
  iVar2 = x->b_n;
  while (bVar9 = iVar2 != 0, iVar2 = iVar2 + -1, sVar8 = uVar5, bVar9) {
    iVar7 = (int)uVar5;
    if (a->a_type == A_SEMI) {
      if (iVar7 == 0) {
        sVar8 = 0;
      }
      else {
LAB_001625b3:
        if (old[(long)iVar7 + -1] == ' ') {
          sVar8 = (ulong)(iVar7 - 1);
        }
      }
    }
    else if (iVar7 != 0 && a->a_type == A_COMMA) goto LAB_001625b3;
    atom_string(a,string,1000);
    sVar4 = strlen(string);
    iVar7 = (int)sVar8;
    uVar3 = (int)sVar4 + iVar7 + 1;
    uVar5 = (ulong)uVar3;
    pcVar6 = (char *)resizebytes(old,(long)iVar7,(long)(int)uVar3);
    if (pcVar6 == (char *)0x0) break;
    strcpy(pcVar6 + iVar7,string);
    cVar1 = '\n';
    if (a->a_type != A_SEMI) {
      cVar1 = ' ';
    }
    pcVar6[iVar7 + (int)sVar4] = cVar1;
    a = a + 1;
    old = pcVar6;
  }
  iVar2 = (int)sVar8;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    oldsize = (size_t)iVar2;
    if (old[oldsize - 1] == ' ') {
      pcVar6 = (char *)resizebytes(old,oldsize,oldsize - 1);
      if (pcVar6 != (char *)0x0) {
        sVar8 = oldsize - 1;
      }
      iVar2 = (int)sVar8;
      if (pcVar6 != (char *)0x0) {
        old = pcVar6;
      }
    }
  }
  *bufp = old;
  *lengthp = iVar2;
  return;
}

Assistant:

void binbuf_gettext(const t_binbuf *x, char **bufp, int *lengthp)
{
    char *buf = getbytes(0), *newbuf;
    int length = 0;
    char string[MAXPDSTRING];
    const t_atom *ap;
    int indx;

    for (ap = x->b_vec, indx = x->b_n; indx--; ap++)
    {
        int newlength;
        if ((ap->a_type == A_SEMI || ap->a_type == A_COMMA) &&
                length && buf[length-1] == ' ') length--;
        atom_string(ap, string, MAXPDSTRING);
        newlength = length + (int)strlen(string) + 1;
        if (!(newbuf = resizebytes(buf, length, newlength))) break;
        buf = newbuf;
        strcpy(buf + length, string);
        length = newlength;
        if (ap->a_type == A_SEMI) buf[length-1] = '\n';
        else buf[length-1] = ' ';
    }
    if (length && buf[length-1] == ' ')
    {
        if ((newbuf = t_resizebytes(buf, length, length-1)))
        {
            buf = newbuf;
            length--;
        }
    }
    *bufp = buf;
    *lengthp = length;
}